

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O3

size_t Jupiter_minBase64DecodeLength(char *data,size_t inLen)

{
  long lVar1;
  
  if (inLen == 0) {
    return 0;
  }
  if (data[inLen - 1] == '=') {
    lVar1 = (inLen >> 2) * 3;
    if (data[inLen - 2] == '=') {
      return lVar1 - 2;
    }
    return lVar1 - 1;
  }
  return (inLen >> 2) * 3;
}

Assistant:

size_t Jupiter_minBase64DecodeLength(const char *data, size_t inLen)
{
	if (inLen == 0) return 0;
	data += inLen - 1;
	if (*data == '=')
	{
		data--;
		if (*data == '=')
			return inLen / 4 * 3 - 2;

		return inLen / 4 * 3 - 1;
	}
	return inLen / 4 * 3;
}